

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::DecommitPages<true>
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,void *address,uint pageCount)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  PageAllocatorBaseCommon *pPVar5;
  AllocatorType *pAVar6;
  BVIndex BVar7;
  undefined8 *in_FS_OFFSET;
  
  if (address < (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x229,"(address >= this->address)","address >= this->address");
    if (!bVar3) goto LAB_00277739;
    *puVar1 = 0;
  }
  pPVar5 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator;
  pAVar6 = &pPVar5[-1].allocatorType;
  if (pPVar5 == (PageAllocatorBaseCommon *)0x0) {
    pAVar6 = (AllocatorType *)0x0;
  }
  if (pAVar6[0x28] < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22a,"(pageCount <= this->GetAllocator()->maxAllocPageCount)",
                       "pageCount <= this->GetAllocator()->maxAllocPageCount");
    if (!bVar3) goto LAB_00277739;
    *puVar1 = 0;
    pPVar5 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.
             allocator;
  }
  pAVar6 = &pPVar5[-1].allocatorType;
  if (pPVar5 == (PageAllocatorBaseCommon *)0x0) {
    pAVar6 = (AllocatorType *)0x0;
  }
  if ((pAVar6[0x28] - pageCount) * 0x1000 <
      (uint)((int)address - *(int *)&(this->super_SegmentBase<Memory::VirtualAllocWrapper>).address)
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22c,
                       "(((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize)"
                       ,
                       "((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize"
                      );
    if (!bVar3) goto LAB_00277739;
    *puVar1 = 0;
  }
  bVar3 = IsFreeOrDecommitted(this,address,pageCount);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22e,"(!IsFreeOrDecommitted(address, pageCount))",
                       "!IsFreeOrDecommitted(address, pageCount)");
    if (!bVar3) goto LAB_00277739;
    *puVar1 = 0;
  }
  BVStatic<272UL>::SetRange
            (&this->decommitPages,
             (uint)((int)address -
                   *(int *)&(this->super_SegmentBase<Memory::VirtualAllocWrapper>).address) >> 0xc,
             pageCount);
  BVar7 = pageCount + this->decommitPageCount;
  this->decommitPageCount = BVar7;
  BVar4 = BVStatic<272UL>::Count(&this->decommitPages);
  if (BVar7 != BVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x23b,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar3) {
LAB_00277739:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return;
}

Assistant:

void
PageSegmentBase<T>::DecommitPages(__in void * address, uint pageCount)
{
    Assert(address >= this->address);
    Assert(pageCount <= this->GetAllocator()->maxAllocPageCount);
    Assert(((uint)(((char *)address) - this->address))
      <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize);

    Assert(!IsFreeOrDecommitted(address, pageCount));
    uint base = this->GetBitRangeBase(address);

    this->SetRangeInDecommitPagesBitVector(base, pageCount);
    this->decommitPageCount += pageCount;

    if (!onlyUpdateState)
    {
#pragma warning(suppress: 6250)
        this->GetAllocator()->GetVirtualAllocator()->Free(address,
          pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
    }

    Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());
}